

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

void device2(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  char *in_RCX;
  int sock;
  int sock_00;
  
  line = test_socket_impl((char *)0x44,2,0x51,(int)in_RCX);
  test_bind_impl((char *)0x45,line,0x1021e2,in_RCX);
  line_00 = test_socket_impl((char *)0x46,2,0x50,(int)in_RCX);
  test_bind_impl((char *)0x47,line_00,0x1021ed,in_RCX);
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x4e,line_00,sock);
      test_close_impl((char *)0x4f,line,sock_00);
      return;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c",
          0x4b);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device2 (NN_UNUSED void *arg)
{
    int rc;
    int devc;
    int devd;

    /*  Intialise the device sockets. */
    devc = test_socket (AF_SP_RAW, NN_PULL);
    test_bind (devc, SOCKET_ADDRESS_C);
    devd = test_socket (AF_SP_RAW, NN_PUSH);
    test_bind (devd, SOCKET_ADDRESS_D);

    /*  Run the device. */
    rc = nn_device (devc, devd);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (devd);
    test_close (devc);
}